

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  int *piVar1;
  Btree *p;
  BtCursor *pBVar2;
  BtCursor *pBVar3;
  Pgno *pPVar4;
  BtCursor *pBVar5;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  MemPage *pPage1;
  BtCursor *pBVar6;
  long lVar7;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBVar2 = (BtCursor *)pCur->pBt;
    if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
      btreeLockCarefully(p);
    }
    sqlite3_free(pCur->pKey);
    pCur->pKey = (void *)0x0;
    pCur->eState = '\0';
    pBVar6 = pBVar2->pNext;
    pBVar5 = pBVar2;
    if (pBVar2->pNext == pCur) {
LAB_00132632:
      pBVar5->pNext = pCur->pNext;
    }
    else {
      do {
        pBVar3 = pBVar6->pNext;
        pBVar5 = pBVar6;
        if (pBVar3 == pCur) goto LAB_00132632;
        pBVar6 = pBVar3;
      } while (pBVar3 != (BtCursor *)0x0);
    }
    if (-1 < pCur->iPage) {
      lVar7 = -1;
      do {
        if (pCur->apPage[lVar7 + 1] != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pCur->apPage[lVar7 + 1]->pDbPage);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pCur->iPage);
    }
    if ((*(char *)((long)&(pBVar2->info).nKey + 4) == '\0') &&
       (pPVar4 = pBVar2->aOverflow, pPVar4 != (Pgno *)0x0)) {
      pBVar2->aOverflow = (Pgno *)0x0;
      sqlite3PagerUnrefNotNull(*(DbPage **)(pPVar4 + 0x1c));
    }
    sqlite3_free(pCur->aOverflow);
    in_EAX = extraout_EAX;
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
        return extraout_EAX_00;
      }
    }
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    int i;
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    sqlite3BtreeClearCursor(pCur);
    assert( pBt->pCursor!=0 );
    if( pBt->pCursor==pCur ){
      pBt->pCursor = pCur->pNext;
    }else{
      BtCursor *pPrev = pBt->pCursor;
      do{
        if( pPrev->pNext==pCur ){
          pPrev->pNext = pCur->pNext;
          break;
        }
        pPrev = pPrev->pNext;
      }while( ALWAYS(pPrev) );
    }
    for(i=0; i<=pCur->iPage; i++){
      releasePage(pCur->apPage[i]);
    }
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    /* sqlite3_free(pCur); */
    sqlite3BtreeLeave(pBtree);
  }
  return SQLITE_OK;
}